

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::checkLimits(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  HighsLp *pHVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Result RVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  uVar10 = (long)(postsolve_stack->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(postsolve_stack->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)uVar10 >> 4;
  uVar5 = debugGetCheckCol(this);
  uVar6 = debugGetCheckRow(this);
  if ((int)(uVar6 & uVar5) < 0) goto LAB_0030ba05;
  uVar8 = (ulong)uVar6;
  bVar4 = true;
  bVar3 = true;
  if (-1 < (int)uVar5) {
    pHVar1 = this->model;
    if (uVar10 == 0x10) {
      dVar11 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
LAB_0030b8f7:
      bVar3 = false;
    }
    else {
      dVar11 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
      if ((postsolve_stack->debug_prev_col_lower != dVar11) ||
         (NAN(postsolve_stack->debug_prev_col_lower) || NAN(dVar11))) goto LAB_0030b8f7;
      bVar3 = (pHVar1->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5] == postsolve_stack->debug_prev_col_upper;
    }
    postsolve_stack->debug_prev_col_lower = dVar11;
    postsolve_stack->debug_prev_col_upper =
         (pHVar1->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5];
  }
  if (-1 < (int)uVar6) {
    pHVar1 = this->model;
    if (uVar10 == 0x10) {
      dVar11 = (pHVar1->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
LAB_0030b948:
      bVar4 = false;
    }
    else {
      dVar11 = (pHVar1->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      if ((postsolve_stack->debug_prev_row_lower != dVar11) ||
         (NAN(postsolve_stack->debug_prev_row_lower) || NAN(dVar11))) goto LAB_0030b948;
      bVar4 = (pHVar1->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] == postsolve_stack->debug_prev_row_upper;
    }
    postsolve_stack->debug_prev_row_lower = dVar11;
    postsolve_stack->debug_prev_row_upper =
         (pHVar1->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar8];
  }
  uVar2 = postsolve_stack->debug_prev_numreductions;
  if (!bVar3 && uVar2 < uVar9) {
    pHVar1 = this->model;
    printf("After reduction %4d: col = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar5],
           (pHVar1->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar5],(ulong)((int)uVar9 - 1),(ulong)uVar5,
           (pHVar1->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p);
    postsolve_stack->debug_prev_numreductions = uVar9;
  }
  if (!bVar4 && uVar2 < uVar9) {
    pHVar1 = this->model;
    printf("After reduction %4d: row = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           (pHVar1->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8],
           (pHVar1->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8],(ulong)((int)uVar9 - 1),uVar8,
           (pHVar1->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
    postsolve_stack->debug_prev_numreductions = uVar9;
  }
LAB_0030ba05:
  if (((uVar10 & 0x3ff0) == 0) && (RVar7 = checkTimeLimit(this), RVar7 != kOk)) {
    return RVar7;
  }
  return (uint)(this->reductionLimit <= uVar9) * 3;
}

Assistant:

HPresolve::Result HPresolve::checkLimits(HighsPostsolveStack& postsolve_stack) {
  size_t numreductions = postsolve_stack.numReductions();

  bool debug_report = false;
  HighsInt check_col = debugGetCheckCol();
  HighsInt check_row = debugGetCheckRow();
  bool col_bound_change = false;
  bool row_bound_change = false;
  if (check_col >= 0 || check_row >= 0) {
    if (check_col >= 0) {
      col_bound_change =
          numreductions == 1 ||
          postsolve_stack.debug_prev_col_lower !=
              model->col_lower_[check_col] ||
          postsolve_stack.debug_prev_col_upper != model->col_upper_[check_col];
      postsolve_stack.debug_prev_col_lower = model->col_lower_[check_col];
      postsolve_stack.debug_prev_col_upper = model->col_upper_[check_col];
    }
    if (check_row >= 0) {
      row_bound_change =
          numreductions == 1 ||
          postsolve_stack.debug_prev_row_lower !=
              model->row_lower_[check_row] ||
          postsolve_stack.debug_prev_row_upper != model->row_upper_[check_row];
      postsolve_stack.debug_prev_row_lower = model->row_lower_[check_row];
      postsolve_stack.debug_prev_row_upper = model->row_upper_[check_row];
    }
    debug_report = numreductions > postsolve_stack.debug_prev_numreductions;
  }
  if (check_col >= 0 && col_bound_change && debug_report) {
    printf("After reduction %4d: col = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           static_cast<int>(numreductions - 1), static_cast<int>(check_col),
           model->col_names_[check_col].c_str(), model->col_lower_[check_col],
           model->col_upper_[check_col]);
    postsolve_stack.debug_prev_numreductions = numreductions;
  }
  if (check_row >= 0 && row_bound_change && debug_report) {
    printf("After reduction %4d: row = %4d[%s] has bounds [%11.4g, %11.4g]\n",
           static_cast<int>(numreductions - 1), static_cast<int>(check_row),
           model->row_names_[check_row].c_str(), model->row_lower_[check_row],
           model->row_upper_[check_row]);
    postsolve_stack.debug_prev_numreductions = numreductions;
  }

  if ((numreductions & 1023u) == 0) HPRESOLVE_CHECKED_CALL(checkTimeLimit());

  return numreductions >= reductionLimit ? Result::kStopped : Result::kOk;
}